

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O1

bool __thiscall NJamSpell::TSpellCorrector::SaveCache(TSpellCorrector *this,string *cacheFile)

{
  char cVar1;
  bool bVar2;
  long local_218;
  ofstream out;
  ios_base local_120 [264];
  uint64_t local_18;
  
  std::ofstream::ofstream(&local_218,(string *)cacheFile,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (((cVar1 == '\0') ||
      ((this->Deletes1)._M_t.
       super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
       ._M_t.
       super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
       .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl == (TBloomFilter *)0x0)
      ) || ((this->Deletes2)._M_t.
            super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
            ._M_t.
            super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
            .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl ==
            (TBloomFilter *)0x0)) {
    bVar2 = false;
  }
  else {
    std::ostream::write((char *)&local_218,0x13add0);
    std::ostream::write((char *)&local_218,0x13add8);
    local_18 = TLangModel::GetCheckSum(&this->LangModel);
    std::ostream::write((char *)&local_218,(long)&local_18);
    TBloomFilter::Dump((this->Deletes1)._M_t.
                       super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                       .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl,
                       (ostream *)&local_218);
    TBloomFilter::Dump((this->Deletes2)._M_t.
                       super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                       .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl,
                       (ostream *)&local_218);
    bVar2 = true;
    std::ostream::write((char *)&local_218,0x13add0);
  }
  local_218 = _VTT;
  *(undefined8 *)((long)&local_218 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&out);
  std::ios_base::~ios_base(local_120);
  return bVar2;
}

Assistant:

bool TSpellCorrector::SaveCache(const std::string& cacheFile) {
    std::ofstream out(cacheFile, std::ios::binary);
    if (!out.is_open()) {
        return false;
    }
    if (!Deletes1 || !Deletes2) {
        return false;
    }
    NHandyPack::Dump(out, SPELL_CHECKER_CACHE_MAGIC_BYTE);
    NHandyPack::Dump(out, SPELL_CHECKER_CACHE_VERSION);
    NHandyPack::Dump(out, LangModel.GetCheckSum());
    Deletes1->Dump(out);
    Deletes2->Dump(out);
    NHandyPack::Dump(out, SPELL_CHECKER_CACHE_MAGIC_BYTE);
    return true;
}